

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_ev.c
# Opt level: O2

CURLMcode mev_forget_socket(Curl_multi *multi,Curl_easy *data,curl_socket_t s,char *cause)

{
  curl_trc_feat *pcVar1;
  int iVar2;
  mev_sh_entry *pmVar3;
  curl_socket_callback p_Var4;
  CURLMcode CVar5;
  
  pmVar3 = mev_sh_entry_get(&(multi->ev).sh_entries,s);
  CVar5 = CURLM_OK;
  if (pmVar3 != (mev_sh_entry *)0x0) {
    p_Var4 = multi->socket_cb;
    if (p_Var4 == (curl_socket_callback)0x0) {
      mev_sh_entry_kill(multi,s);
      CVar5 = CURLM_OK;
    }
    else {
      if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
          ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level)))
          ) && (0 < Curl_trc_feat_multi.log_level)) {
        Curl_trc_multi(data,"ev %s, call(fd=%d, ev=REMOVE)",cause,(ulong)(uint)s);
        p_Var4 = multi->socket_cb;
      }
      multi->field_0x271 = multi->field_0x271 | 4;
      iVar2 = (*p_Var4)(data,s,4,multi->socket_userp,pmVar3->user_data);
      multi->field_0x271 = multi->field_0x271 & 0xfb;
      mev_sh_entry_kill(multi,s);
      if (iVar2 == -1) {
        multi->field_0x271 = multi->field_0x271 | 0x10;
        CVar5 = CURLM_ABORTED_BY_CALLBACK;
      }
    }
  }
  return CVar5;
}

Assistant:

static CURLMcode mev_forget_socket(struct Curl_multi *multi,
                                   struct Curl_easy *data,
                                   curl_socket_t s,
                                   const char *cause)
{
  struct mev_sh_entry *entry = mev_sh_entry_get(&multi->ev.sh_entries, s);
  int rc = 0;

  if(!entry) /* we never knew or already forgot about this socket */
    return CURLM_OK;

  /* We managed this socket before, tell the socket callback to forget it. */
  if(multi->socket_cb) {
    CURL_TRC_M(data, "ev %s, call(fd=%" FMT_SOCKET_T ", ev=REMOVE)",
               cause, s);
    mev_in_callback(multi, TRUE);
    rc = multi->socket_cb(data, s, CURL_POLL_REMOVE,
                          multi->socket_userp, entry->user_data);
    mev_in_callback(multi, FALSE);
  }

  mev_sh_entry_kill(multi, s);
  if(rc == -1) {
    multi->dead = TRUE;
    return CURLM_ABORTED_BY_CALLBACK;
  }
  return CURLM_OK;
}